

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O1

base_learner * CSOAA::csoaa_setup(options_i *options,vw *all)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  csoaa *dat;
  polyprediction *ppVar3;
  base_learner *l;
  single_learner *base;
  learner<CSOAA::csoaa,_example> *plVar4;
  long lVar5;
  undefined **ppuVar6;
  label_parser *plVar7;
  byte bVar8;
  size_type __dnew_1;
  option_group_definition new_options;
  size_type __dnew;
  _func_int ***local_170;
  _func_int **local_168;
  _func_int **local_160 [2];
  long local_150;
  long *local_148;
  long local_140;
  long local_138 [2];
  option_group_definition local_128;
  string local_f0;
  undefined1 local_d0 [112];
  bool local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar8 = 0;
  dat = calloc_or_throw<CSOAA::csoaa>(1);
  *(undefined8 *)dat = 0;
  dat->pred = (polyprediction *)0x0;
  local_d0._0_8_ = (_func_int **)0x1e;
  local_170 = local_160;
  local_170 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_170,(ulong)local_d0);
  local_160[0] = (_func_int **)local_d0._0_8_;
  builtin_strncpy((char *)((long)local_170 + 0xe)," One Aga",8);
  builtin_strncpy((char *)((long)local_170 + 0x16),"inst All",8);
  *(undefined4 *)local_170 = 0x74736f43;
  builtin_strncpy((char *)((long)local_170 + 4)," Sen",4);
  *(undefined4 *)(local_170 + 1) = 0x69746973;
  builtin_strncpy((char *)((long)local_170 + 0xc),"ve O",4);
  local_168 = (_func_int **)local_d0._0_8_;
  *(char *)((long)local_170 + local_d0._0_8_) = '\0';
  paVar1 = &local_128.m_name.field_2;
  local_128.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,local_170,(char *)(local_d0._0_8_ + (long)local_170));
  local_128.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_170 != local_160) {
    operator_delete(local_170);
  }
  local_f0.field_2._M_allocated_capacity._0_4_ = 0x616f7363;
  local_f0.field_2._M_allocated_capacity._4_2_ = 0x61;
  local_f0._M_string_length = 5;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_d0,&local_f0,&dat->num_classes);
  local_60 = true;
  local_150 = 0x29;
  local_148 = local_138;
  local_148 = (long *)std::__cxx11::string::_M_create((ulong *)&local_148,(ulong)&local_150);
  local_138[0] = local_150;
  builtin_strncpy((char *)((long)local_148 + 0x19),"s with <",8);
  builtin_strncpy((char *)((long)local_148 + 0x21),"k> costs",8);
  local_148[2] = 0x616c6369746c756d;
  local_148[3] = 0x2068746977207373;
  *local_148 = 0x696167612d656e4f;
  local_148[1] = 0x206c6c612d74736e;
  local_140 = local_150;
  *(char *)((long)local_148 + local_150) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (&local_128,(typed_option<unsigned_int> *)local_d0);
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  local_d0._0_8_ = &PTR__typed_option_002e8f90;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_128);
  local_d0._16_4_ = 0x616f7363;
  local_d0._20_2_ = 0x61;
  local_d0._8_8_ = (pointer)0x5;
  local_d0._0_8_ = local_d0 + 0x10;
  iVar2 = (*options->_vptr_options_i[1])(options,local_d0);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_);
  }
  if ((char)iVar2 == '\0') {
    plVar4 = (learner<CSOAA::csoaa,_example> *)0x0;
  }
  else {
    ppVar3 = calloc_or_throw<polyprediction>((ulong)dat->num_classes);
    dat->pred = ppVar3;
    l = setup_base(all->options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar4 = LEARNER::learner<CSOAA::csoaa,example>::init_learner<LEARNER::learner<char,example>>
                       (dat,base,predict_or_learn<true>,predict_or_learn<false>,
                        (ulong)dat->num_classes,multiclass);
    ppuVar6 = &COST_SENSITIVE::cs_label;
    plVar7 = &all->p->lp;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      plVar7->default_label = (_func_void_void_ptr *)*ppuVar6;
      ppuVar6 = ppuVar6 + (ulong)bVar8 * -2 + 1;
      plVar7 = (label_parser *)((long)plVar7 + (ulong)bVar8 * -0x10 + 8);
    }
    all->label_type = cs;
    *(undefined8 *)(plVar4 + 0x58) = *(undefined8 *)(plVar4 + 0x18);
    *(code **)(plVar4 + 0x68) = finish_example;
    *(undefined8 *)(plVar4 + 0xb8) = *(undefined8 *)(plVar4 + 0x18);
    *(undefined8 *)(plVar4 + 0xc0) = *(undefined8 *)(plVar4 + 0x20);
    *(code **)(plVar4 + 200) = finish;
    all->cost_sensitive = (base_learner *)plVar4;
    dat = (csoaa *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_128.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_128.m_name._M_dataplus._M_p);
  }
  if (dat != (csoaa *)0x0) {
    free(dat);
  }
  return (base_learner *)plVar4;
}

Assistant:

base_learner* csoaa_setup(options_i& options, vw& all)
{
  auto c = scoped_calloc_or_throw<csoaa>();
  option_group_definition new_options("Cost Sensitive One Against All");
  new_options.add(make_option("csoaa", c->num_classes).keep().help("One-against-all multiclass with <k> costs"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("csoaa"))
    return nullptr;

  c->pred = calloc_or_throw<polyprediction>(c->num_classes);

  learner<csoaa, example>& l = init_learner(c, as_singleline(setup_base(*all.options, all)), predict_or_learn<true>,
      predict_or_learn<false>, c->num_classes, prediction_type::multiclass);
  all.p->lp = cs_label;
  all.label_type = label_type::cs;

  l.set_finish_example(finish_example);
  l.set_finish(finish);
  all.cost_sensitive = make_base(l);
  return all.cost_sensitive;
}